

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall SQCompilation::NodeEqualChecker::check(NodeEqualChecker *this,Node *lhs,Node *rhs)

{
  TreeOp TVar1;
  TreeOp TVar2;
  CallExpr *in_RDX;
  CallExpr *in_RSI;
  CallExpr *in_RDI;
  FunctionDecl *unaff_retaddr;
  SwitchStatement *in_stack_00000008;
  SwitchStatement *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd0;
  CallExpr *l;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  if (in_RSI == in_RDX) {
    bVar3 = true;
  }
  else if ((in_RSI == (CallExpr *)0x0) || (in_RDX == (CallExpr *)0x0)) {
    bVar3 = false;
  }
  else {
    l = in_RDI;
    TVar1 = Node::op((Node *)in_RSI);
    TVar2 = Node::op((Node *)in_RDX);
    if (TVar1 == TVar2) {
      TVar2 = Node::op((Node *)in_RSI);
      switch(TVar2) {
      case TO_BLOCK:
        bVar3 = cmpBlock((NodeEqualChecker *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(Block *)l,
                         (Block *)in_RSI);
        break;
      case TO_IF:
        bVar3 = cmpIf((NodeEqualChecker *)
                      CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(IfStatement *)l
                      ,(IfStatement *)in_RSI);
        break;
      case TO_WHILE:
        bVar3 = cmpWhile((NodeEqualChecker *)in_RSI,(WhileStatement *)in_RDX,
                         (WhileStatement *)in_RDI);
        break;
      case TO_DOWHILE:
        bVar3 = cmpDoWhile((NodeEqualChecker *)in_RSI,(DoWhileStatement *)in_RDX,
                           (DoWhileStatement *)in_RDI);
        break;
      case TO_FOR:
        bVar3 = cmpFor((NodeEqualChecker *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (ForStatement *)l,(ForStatement *)in_RSI);
        break;
      case TO_FOREACH:
        bVar3 = cmpForeach((NodeEqualChecker *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           (ForeachStatement *)l,(ForeachStatement *)in_RSI);
        break;
      case TO_SWITCH:
        bVar3 = cmpSwitch((NodeEqualChecker *)rhs,in_stack_00000010,in_stack_00000008);
        break;
      case TO_RETURN:
        bVar3 = cmpReturn((NodeEqualChecker *)in_RDX,(ReturnStatement *)in_RDI,
                          (ReturnStatement *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_YIELD:
      case TO_THROW:
        bVar3 = cmpTerminate((NodeEqualChecker *)in_RDX,(TerminateStatement *)in_RDI,
                             (TerminateStatement *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_TRY:
        bVar3 = cmpTry((NodeEqualChecker *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (TryStatement *)l,(TryStatement *)in_RSI);
        break;
      case TO_BREAK:
      case TO_CONTINUE:
      case TO_EMPTY:
      case TO_BASE:
      case TO_ROOT_TABLE_ACCESS:
        bVar3 = true;
        break;
      case TO_EXPR_STMT:
        bVar3 = cmpExprStmt((NodeEqualChecker *)in_RDX,(ExprStatement *)in_RDI,
                            (ExprStatement *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_ID:
        bVar3 = cmpId((NodeEqualChecker *)in_RDX,(Id *)in_RDI,
                      (Id *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_COMMA:
        bVar3 = cmpComma((NodeEqualChecker *)in_RDX,(CommaExpr *)in_RDI,
                         (CommaExpr *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_NULLC:
      case TO_ASSIGN:
      case TO_OROR:
      case TO_ANDAND:
      case TO_OR:
      case TO_XOR:
      case TO_AND:
      case TO_NE:
      case TO_EQ:
      case TO_3CMP:
      case TO_GE:
      case TO_GT:
      case TO_LE:
      case TO_LT:
      case TO_IN:
      case TO_INSTANCEOF:
      case TO_USHR:
      case TO_SHR:
      case TO_SHL:
      case TO_MUL:
      case TO_DIV:
      case TO_MOD:
      case TO_ADD:
      case TO_SUB:
      case TO_NEWSLOT:
      case TO_PLUSEQ:
      case TO_MINUSEQ:
      case TO_MULEQ:
      case TO_DIVEQ:
      case TO_MODEQ:
        bVar3 = cmpBinary((NodeEqualChecker *)l,(BinExpr *)in_RSI,(BinExpr *)in_RDX);
        break;
      case TO_NOT:
      case TO_BNOT:
      case TO_NEG:
      case TO_TYPEOF:
      case TO_RESUME:
      case TO_CLONE:
      case TO_PAREN:
      case TO_DELETE:
        bVar3 = cmpUnary((NodeEqualChecker *)in_RDX,(UnExpr *)in_RDI,
                         (UnExpr *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_LITERAL:
        bVar3 = cmpLiterals((NodeEqualChecker *)in_RSI,(LiteralExpr *)in_RDX,(LiteralExpr *)in_RDI);
        break;
      case TO_INC:
        bVar3 = cmpIncExpr((NodeEqualChecker *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           (IncExpr *)l,(IncExpr *)in_RSI);
        break;
      case TO_DECL_EXPR:
        bVar3 = cmpDeclExpr((NodeEqualChecker *)in_RDX,(DeclExpr *)in_RDI,
                            (DeclExpr *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_ARRAYEXPR:
        bVar3 = cmpArrayExpr((NodeEqualChecker *)in_RDX,(ArrayExpr *)in_RDI,
                             (ArrayExpr *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_GETFIELD:
        bVar3 = cmpGetField((NodeEqualChecker *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                            (GetFieldExpr *)l,(GetFieldExpr *)in_RSI);
        break;
      case TO_SETFIELD:
      case TO_SETSLOT:
      default:
        bVar3 = false;
        break;
      case TO_GETSLOT:
        bVar3 = cmpGetSlot((NodeEqualChecker *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           (GetSlotExpr *)l,(GetSlotExpr *)in_RSI);
        break;
      case TO_CALL:
        bVar3 = cmpCallExpr((NodeEqualChecker *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),l,in_RSI);
        break;
      case TO_TERNARY:
        bVar3 = cmpTernary((NodeEqualChecker *)unaff_retaddr,
                           (TerExpr *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           (TerExpr *)l);
        break;
      case TO_VAR:
        bVar3 = cmpVarDecl((NodeEqualChecker *)in_RDX,(VarDecl *)in_RDI,
                           (VarDecl *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_PARAM:
        bVar3 = cmpValueDecl((NodeEqualChecker *)in_RSI,(ValueDecl *)in_RDX,(ValueDecl *)in_RDI);
        break;
      case TO_CONST:
        bVar3 = cmpConst((NodeEqualChecker *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         (ConstDecl *)l,(ConstDecl *)in_RSI);
        break;
      case TO_DECL_GROUP:
        bVar3 = cmpDeclGroup((NodeEqualChecker *)in_RDX,(DeclGroup *)in_RDI,
                             (DeclGroup *)CONCAT44(TVar1,in_stack_ffffffffffffffd0));
        break;
      case TO_DESTRUCTURE:
        bVar3 = cmpDestructDecl((NodeEqualChecker *)l,(DestructuringDecl *)in_RSI,
                                (DestructuringDecl *)in_RDX);
        break;
      case TO_FUNCTION:
      case TO_CONSTRUCTOR:
        bVar3 = cmpFunction((NodeEqualChecker *)in_stack_00000008,unaff_retaddr,
                            (FunctionDecl *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        break;
      case TO_CLASS:
        bVar3 = cmpClass((NodeEqualChecker *)in_RSI,(ClassDecl *)in_RDX,(ClassDecl *)in_RDI);
        break;
      case TO_ENUM:
        bVar3 = cmpEnumDecl((NodeEqualChecker *)rhs,(EnumDecl *)in_stack_00000010,
                            (EnumDecl *)in_stack_00000008);
        break;
      case TO_TABLE:
        bVar3 = cmpTable((NodeEqualChecker *)rhs,(TableDecl *)in_stack_00000010,
                         (TableDecl *)in_stack_00000008);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool check(const Node *lhs, const Node *rhs) const {

    if (lhs == rhs)
      return true;

    if (!lhs || !rhs)
      return false;

    if (lhs->op() != rhs->op())
      return false;

    switch (lhs->op())
    {
    case TO_BLOCK:      return cmpBlock((const Block *)lhs, (const Block *)rhs);
    case TO_IF:         return cmpIf((const IfStatement *)lhs, (const IfStatement *)rhs);
    case TO_WHILE:      return cmpWhile((const WhileStatement *)lhs, (const WhileStatement *)rhs);
    case TO_DOWHILE:    return cmpDoWhile((const DoWhileStatement *)lhs, (const DoWhileStatement *)rhs);
    case TO_FOR:        return cmpFor((const ForStatement *)lhs, (const ForStatement *)rhs);
    case TO_FOREACH:    return cmpForeach((const ForeachStatement *)lhs, (const ForeachStatement *)rhs);
    case TO_SWITCH:     return cmpSwitch((const SwitchStatement *)lhs, (const SwitchStatement *)rhs);
    case TO_RETURN:
      return cmpReturn((const ReturnStatement *)lhs, (const ReturnStatement *)rhs);
    case TO_YIELD:
    case TO_THROW:
      return cmpTerminate((const TerminateStatement *)lhs, (const TerminateStatement *)rhs);
    case TO_TRY:
      return cmpTry((const TryStatement *)lhs, (const TryStatement *)rhs);
    case TO_BREAK:
    case TO_CONTINUE:
    case TO_EMPTY:
    case TO_BASE:
    case TO_ROOT_TABLE_ACCESS:
      return true;
    case TO_EXPR_STMT:
      return cmpExprStmt((const ExprStatement *)lhs, (const ExprStatement *)rhs);

      //case TO_STATEMENT_MARK:
    case TO_ID:         return cmpId((const Id *)lhs, (const Id *)rhs);
    case TO_COMMA:      return cmpComma((const CommaExpr *)lhs, (const CommaExpr *)rhs);
    case TO_NULLC:
    case TO_ASSIGN:
    case TO_OROR:
    case TO_ANDAND:
    case TO_OR:
    case TO_XOR:
    case TO_AND:
    case TO_NE:
    case TO_EQ:
    case TO_3CMP:
    case TO_GE:
    case TO_GT:
    case TO_LE:
    case TO_LT:
    case TO_IN:
    case TO_INSTANCEOF:
    case TO_USHR:
    case TO_SHR:
    case TO_SHL:
    case TO_MUL:
    case TO_DIV:
    case TO_MOD:
    case TO_ADD:
    case TO_SUB:
    case TO_NEWSLOT:
    case TO_PLUSEQ:
    case TO_MINUSEQ:
    case TO_MULEQ:
    case TO_DIVEQ:
    case TO_MODEQ:
      return cmpBinary((const BinExpr *)lhs, (const BinExpr *)rhs);
    case TO_NOT:
    case TO_BNOT:
    case TO_NEG:
    case TO_TYPEOF:
    case TO_RESUME:
    case TO_CLONE:
    case TO_PAREN:
    case TO_DELETE:
      return cmpUnary((const UnExpr *)lhs, (const UnExpr *)rhs);
    case TO_LITERAL:
      return cmpLiterals((const LiteralExpr *)lhs, (const LiteralExpr *)rhs);
    case TO_INC:
      return cmpIncExpr((const IncExpr *)lhs, (const IncExpr *)rhs);
    case TO_DECL_EXPR:
      return cmpDeclExpr((const DeclExpr *)lhs, (const DeclExpr *)rhs);
    case TO_ARRAYEXPR:
      return cmpArrayExpr((const ArrayExpr *)lhs, (const ArrayExpr *)rhs);
    case TO_GETFIELD:
      return cmpGetField((const GetFieldExpr *)lhs, (const GetFieldExpr *)rhs);
    case TO_GETSLOT:
      return cmpGetSlot((const GetSlotExpr *)lhs, (const GetSlotExpr *)rhs);
    case TO_CALL:
      return cmpCallExpr((const CallExpr *)lhs, (const CallExpr *)rhs);
    case TO_TERNARY:
      return cmpTernary((const TerExpr *)lhs, (const TerExpr *)rhs);
      //case TO_EXPR_MARK:
    case TO_VAR:
      return cmpVarDecl((const VarDecl *)lhs, (const VarDecl *)rhs);
    case TO_PARAM:
      return cmpValueDecl((const ValueDecl *)lhs, (const ValueDecl *)rhs);
    case TO_CONST:
      return cmpConst((const ConstDecl *)lhs, (const ConstDecl *)rhs);
    case TO_DECL_GROUP:
      return cmpDeclGroup((const DeclGroup *)lhs, (const DeclGroup *)rhs);
    case TO_DESTRUCTURE:
      return cmpDestructDecl((const DestructuringDecl *)lhs, (const DestructuringDecl *)rhs);
    case TO_FUNCTION:
    case TO_CONSTRUCTOR:
      return cmpFunction((const FunctionDecl *)lhs, (const FunctionDecl *)rhs);
    case TO_CLASS:
      return cmpClass((const ClassDecl *)lhs, (const ClassDecl *)rhs);
    case TO_ENUM:
      return cmpEnumDecl((const EnumDecl *)lhs, (const EnumDecl *)rhs);
    case TO_TABLE:
      return cmpTable((const TableDecl *)lhs, (const TableDecl *)rhs);
    case TO_SETFIELD:
    case TO_SETSLOT:
    default:
      assert(0);
      return false;
    }
  }